

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O2

void __thiscall SharedMatting::gathering(SharedMatting *this)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  pointer pPVar12;
  pointer pPVar13;
  ulong uVar14;
  double dVar15;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> b;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> f;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  B;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  F;
  int local_1b8;
  int local_1b4;
  double local_1b0;
  int local_1a4;
  int local_1a0;
  Point local_188;
  Point local_180;
  Point local_178;
  Point local_170;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_168;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_148;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_128;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_108;
  vector<Tuple,_std::allocator<Tuple>_> *local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  ulong local_c8;
  double local_c0;
  Point_<int> local_b8;
  Point_<int> local_b0;
  Tuple local_a8;
  Matx<double,_4,_1> local_50;
  
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Sample(this,&local_108,&local_128);
  uVar9 = (ulong)((long)(this->uT).
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->uT).
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  local_e8 = &this->tuples;
  uVar14 = 0;
  local_e0 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    local_e0 = uVar14;
  }
  for (; uVar14 != local_e0; uVar14 = uVar14 + 1) {
    pPVar13 = (this->uT).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar5 = pPVar13[uVar14].x;
    iVar6 = pPVar13[uVar14].y;
    local_d0 = (long)iVar5;
    local_d8 = (long)iVar6;
    local_170.x = iVar5;
    local_170.y = iVar6;
    local_c8 = uVar14;
    local_c0 = pfP(this,&local_170,
                   local_108.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14,
                   local_128.
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14);
    pPVar13 = local_108.
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14].
              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1a0 = 0;
    local_1a4 = 0;
    local_1b4 = 0;
    local_1b8 = 0;
    bVar7 = false;
    local_1b0 = 10000000000.0;
    for (; pPVar13 !=
           local_108.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar14].
           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
           super__Vector_impl_data._M_finish; pPVar13 = pPVar13 + 1) {
      iVar8 = iVar5 - pPVar13->x;
      iVar10 = iVar6 - pPVar13->y;
      for (pPVar12 = local_128.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pPVar12 < local_128.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_finish; pPVar12 = pPVar12 + 1) {
        local_b0 = *pPVar13;
        local_b8 = *pPVar12;
        local_178.x = iVar5;
        local_178.y = iVar6;
        dVar15 = gP(this,&local_178,&local_b0,&local_b8,
                    SQRT((double)(iVar10 * iVar10 + iVar8 * iVar8)),local_c0);
        if (dVar15 < local_1b0) {
          local_1b4 = pPVar13->x;
          local_1b8 = pPVar13->y;
          local_1a0 = pPVar12->x;
          local_1a4 = pPVar12->y;
          bVar7 = true;
          local_1b0 = dVar15;
        }
      }
    }
    Tuple::Tuple(&local_a8);
    uVar14 = local_c8;
    local_a8.flag = -1;
    if (bVar7) {
      lVar11 = (long)(this->channels * local_1b8 + this->step * local_1b4);
      bVar1 = this->data[lVar11 + 2];
      uVar3 = *(ushort *)(this->data + lVar11);
      local_a8.flag = 1;
      cv::Matx<double,_4,_1>::Matx(&local_50);
      local_a8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      lVar11 = (long)(this->channels * local_1a4 + this->step * local_1a0);
      bVar2 = this->data[lVar11 + 2];
      uVar4 = *(ushort *)(this->data + lVar11);
      local_a8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)(uVar3 & 0xff);
      local_a8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)(byte)(uVar3 >> 8);
      local_a8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = (double)bVar1;
      cv::Matx<double,_4,_1>::Matx(&local_50);
      local_a8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_180.x = local_1b4;
      local_180.y = local_1b8;
      local_a8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)(uVar4 & 0xff);
      local_a8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)(byte)(uVar4 >> 8);
      local_a8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = (double)bVar2;
      local_a8.sigmaf = sigma2(this,&local_180);
      local_188.x = local_1a0;
      local_188.y = local_1a4;
      local_a8.sigmab = sigma2(this,&local_188);
    }
    std::vector<Tuple,_std::allocator<Tuple>_>::push_back(local_e8,&local_a8);
    this->unknownIndex[local_d0][local_d8] = (int)uVar14;
  }
  if (local_148._M_impl.super__Vector_impl_data._M_finish !=
      local_148._M_impl.super__Vector_impl_data._M_start) {
    local_148._M_impl.super__Vector_impl_data._M_finish =
         local_148._M_impl.super__Vector_impl_data._M_start;
  }
  if (local_168._M_impl.super__Vector_impl_data._M_finish !=
      local_168._M_impl.super__Vector_impl_data._M_start) {
    local_168._M_impl.super__Vector_impl_data._M_finish =
         local_168._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_128);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_108);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base(&local_168);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base(&local_148);
  return;
}

Assistant:

void SharedMatting::gathering()
{
    vector<Point> f;
    vector<Point> b;
    vector<Point>::iterator it;
    vector<Point>::iterator it1;
    vector<Point>::iterator it2;

    vector<vector<Point> > F,B;


    Sample(F, B);

    int index = 0;
    double a;
    int size = uT.size();

    for (int m = 0; m < size; ++m)
    {
        int i = uT[m].x;
        int j = uT[m].y;

        /*f.clear();
        b.clear();*/

        //sample(Point(i, j), f, b);

        /*double pfp = pfP(Point(i, j), f, b);*/

        double pfp = pfP(Point(i, j), F[m], B[m]);
        double gmin = 1.0e10;

        Point tf;
        Point tb;

        bool flag = false;
        bool first = true;

        for (it1 = F[m].begin(); it1 != F[m].end(); ++it1)
        {
            double dpf = dP(Point(i, j), *(it1));
            for (it2 = B[m].begin(); it2 < B[m].end(); ++it2)
            {

                double gp = gP(Point(i, j), *(it1), *(it2), dpf, pfp);
                if (gp < gmin)
                {
                    gmin = gp;
                    tf   = *(it1);
                    tb   = *(it2);
                    flag = true;
                }
            }
        }

        struct Tuple st;
        st.flag = -1;
        if (flag)
        {
            int bc, gc, rc;
            bc = data[tf.x * step +  tf.y * channels];
            gc = data[tf.x * step +  tf.y * channels + 1];
            rc = data[tf.x * step +  tf.y * channels + 2];
            st.flag   = 1;
            st.f      = Scalar(bc, gc, rc);
            bc = data[tb.x * step +  tb.y * channels];
            gc = data[tb.x * step +  tb.y * channels + 1];
            rc = data[tb.x * step +  tb.y * channels + 2];
            st.b      = Scalar(bc, gc, rc);
            st.sigmaf = sigma2(tf);
            st.sigmab = sigma2(tb);
        }

        tuples.push_back(st);
        unknownIndex[i][j] = index;
        ++index;
    }
    f.clear();
    b.clear();

}